

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneticAlgorithm.hpp
# Opt level: O2

void __thiscall
crsGA::
GeneticAlgorithm<Gen,_crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>,_crsGA::DefaultSelectionPolicy<crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>,_crsGA::DefaultCrossoverPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>,_crsGA::DefaultReplacementPolicy<crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>_>
::addFittestOffspring
          (GeneticAlgorithm<Gen,_crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>,_crsGA::DefaultSelectionPolicy<crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>,_crsGA::DefaultCrossoverPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>,_crsGA::DefaultReplacementPolicy<crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>_>
           *this)

{
  pointer pCVar1;
  size_t sVar2;
  uint uVar3;
  Chromosome<Gen,_ComputeFitness> *c;
  pointer this_00;
  vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
  localFittestChromosomes;
  vector<unsigned_long,_std::allocator<unsigned_long>_> leastFittestIndicesList;
  vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
  local_58;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_40;
  
  pCVar1 = (this->_fittestChromosomes).
           super__Vector_base<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (this->_fittestChromosomes).
                 super__Vector_base<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != pCVar1; this_00 = this_00 + 1
      ) {
    Chromosome<Gen,_ComputeFitness>::calculateFitness
              (this_00,(this->_data).super___shared_ptr<crsGA::UserData,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
  }
  DefaultReplacementPolicy<crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>
  ::findLeastFittestIndices
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_40,
             (DefaultReplacementPolicy<crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>
              *)this,&this->_population);
  std::
  vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
  ::vector(&local_58,&this->_fittestChromosomes);
  for (uVar3 = 0;
      (ulong)uVar3 <
      (ulong)((long)local_40._M_impl.super__Vector_impl_data._M_finish -
              (long)local_40._M_impl.super__Vector_impl_data._M_start >> 3); uVar3 = uVar3 + 1) {
    sVar2 = findFittestOffspringIndex(this,&local_58);
    Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
    ::setChromosome(&this->_population,local_40._M_impl.super__Vector_impl_data._M_start[uVar3],
                    local_58.
                    super__Vector_base<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + sVar2);
    std::
    vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
    ::erase(&local_58,
            local_58.
            super__Vector_base<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
            ._M_impl.super__Vector_impl_data._M_start + sVar2);
  }
  std::
  vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
  ::~vector(&local_58);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_40);
  return;
}

Assistant:

void addFittestOffspring()
    {
        //Update fitness values of offspring
        for (auto &c : _fittestChromosomes)
        {
            c.calculateFitness(_data.get());
        }

        //Get index of least fit individual
        auto leastFittestIndicesList = ReplacementPolicy::findLeastFittestIndices(_population);

        //Replace least fittest individual from most fittest offspring
        auto localFittestChromosomes = _fittestChromosomes;
        for (auto i = 0u; i < leastFittestIndicesList.size(); i++)
        {
            auto fittestChromosomeIndex = findFittestOffspringIndex(localFittestChromosomes);
            _population.setChromosome(leastFittestIndicesList[i], localFittestChromosomes[fittestChromosomeIndex]);
            localFittestChromosomes.erase(localFittestChromosomes.begin() + fittestChromosomeIndex);
        }
    }